

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O1

Tick __thiscall MetaSim::Simulation::run_to(Simulation *this,Tick *stop)

{
  Tick TVar1;
  Simulation *this_00;
  
  this_00 = this;
  while( true ) {
    TVar1 = getNextEventTime(this_00);
    if (stop->v < TVar1.v) break;
    this_00 = this;
    TVar1 = sim_step(this);
    (this->globTime).v = TVar1.v;
  }
  if ((this->globTime).v < stop->v) {
    (this->globTime).v = stop->v;
  }
  return (Tick)(this->globTime).v;
}

Assistant:

const Tick Simulation::run_to(const Tick &stop)
    {
        try {
            while (getNextEventTime() <= stop) {
                globTime = sim_step();
            }
        } catch (NoMoreEventsInQueue &e) {
            cerr << "No more events in queue: simulation time = " 
                 << globTime << endl;
        }

        if (globTime < stop) globTime = stop; 

        return globTime;
    }